

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_remove_buffer_Test::TestBody(Buffer_change_event_remove_buffer_Test *this)

{
  initializer_list<bfy_changed_cb_info> __l;
  pointer pbVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_350;
  Message local_348;
  allocator<bfy_changed_cb_info> local_339;
  bfy_changed_cb_info local_338;
  iterator local_318;
  size_type local_310;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_308;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_2;
  Message local_2d8;
  size_t local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_1;
  BufferWithReadonlyStrings tgt;
  bfy_changed_cb_info expected;
  BufferWithReadonlyStrings mabel;
  size_t n;
  size_t i;
  Message local_108 [3];
  size_t local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  BufferWithReadonlyStrings local;
  Buffer_change_event_remove_buffer_Test *this_local;
  
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&gtest_ar.message_);
  local_e4 = 1;
  local_f0 = anon_unknown.dwarf_16b2d::buffer_count_pages
                       ((bfy_buffer *)&gtest_ar.message_,0xffffffffffffffff);
  testing::internal::CmpHelperLT<int,unsigned_long>
            ((internal *)local_e0,"1","buffer_count_pages(&local.buf)",&local_e4,&local_f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar2) {
    testing::Message::Message(local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5ef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  n = 1;
  mabel.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)bfy_buffer_get_content_len((bfy_buffer *)&gtest_ar.message_);
  for (; n < mabel.changes.
             super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; n = n + 1) {
    anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
              ((BufferWithReadonlyStrings *)&expected.n_deleted);
    pbVar1 = mabel.changes.
             super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    expected.orig_size = 0;
    expected.n_added = n;
    anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
              ((BufferWithReadonlyStrings *)&expected.n_deleted);
    anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
              ((BufferWithReadonlyStrings *)&gtest_ar_1.message_);
    local_2d0 = bfy_buffer_remove_buffer
                          ((bfy_buffer *)&expected.n_deleted,n,(bfy_buffer *)&gtest_ar_1.message_);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_2c8,"i","bfy_buffer_remove_buffer(&mabel.buf, i, &tgt.buf)",&n,
               &local_2d0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
    if (!bVar2) {
      testing::Message::Message(&local_2d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                 ,0x5fb,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_2d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
    local_338.n_deleted = expected.n_added;
    local_338.orig_size = (size_t)pbVar1;
    local_338.n_added = expected.orig_size;
    local_318 = &local_338;
    local_310 = 1;
    std::allocator<bfy_changed_cb_info>::allocator(&local_339);
    __l._M_len = local_310;
    __l._M_array = local_318;
    std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
              (&local_308,__l,&local_339);
    testing::internal::EqHelper::
    Compare<std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_nullptr>
              ((EqHelper *)local_2f0,"changes_t{expected}","mabel.changes",&local_308,
               (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
               ((long)&mabel.allstrs.field_2 + 8));
    std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~vector(&local_308);
    std::allocator<bfy_changed_cb_info>::~allocator(&local_339);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
    if (!bVar2) {
      testing::Message::Message(&local_348);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
      testing::internal::AssertHelper::AssertHelper
                (&local_350,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                 ,0x5fc,pcVar3);
      testing::internal::AssertHelper::operator=(&local_350,&local_348);
      testing::internal::AssertHelper::~AssertHelper(&local_350);
      testing::Message::~Message(&local_348);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
    anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
              ((BufferWithReadonlyStrings *)&gtest_ar_1.message_);
    anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
              ((BufferWithReadonlyStrings *)&expected.n_deleted);
  }
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Buffer, change_event_remove_buffer) {
    BufferWithReadonlyStrings const local;
    // confirm this test exercises removing <1, ==1, and >1 pages
    EXPECT_LT(1, buffer_count_pages(&local.buf));

    for (size_t i=1, n=bfy_buffer_get_content_len(&local.buf); i < n; ++i) {
        BufferWithReadonlyStrings mabel;
        auto const expected = bfy_changed_cb_info {
            .orig_size = n,
            .n_added = 0,
            .n_deleted = i
        };

        mabel.start_listening_to_changes();
        BufferWithReadonlyStrings tgt;
        EXPECT_EQ(i, bfy_buffer_remove_buffer(&mabel.buf, i, &tgt.buf));
        EXPECT_EQ(changes_t{expected}, mabel.changes);
    }
}